

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,ByteData *serialize_data)

{
  ByteData256 local_30;
  ByteData *local_18;
  ByteData *serialize_data_local;
  ExtPubkey *this_local;
  
  local_18 = serialize_data;
  serialize_data_local = (ByteData *)this;
  ByteData256::ByteData256(&local_30);
  ExtPubkey(this,serialize_data,&local_30);
  ByteData256::~ByteData256((ByteData256 *)0x465399);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(const ByteData& serialize_data)
    : ExtPubkey(serialize_data, ByteData256()) {
  // do nothing
}